

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCMPrint.cpp
# Opt level: O1

void processSimpleTypeDefinition(XSSimpleTypeDefinition *xsSimpleTypeDef)

{
  uint uVar1;
  bool bVar2;
  long *plVar3;
  wchar16 *pwVar4;
  char *pcVar5;
  size_t sVar6;
  char16_t *pcVar7;
  BaseRefVectorOf<char16_t> *pBVar8;
  uint uVar9;
  XMLSize_t XVar10;
  FACET FVar11;
  ulong uVar12;
  StrX local_40;
  XSSimpleTypeDefinition *local_38;
  
  plVar3 = (long *)(**(code **)(*(long *)xsSimpleTypeDef + 0x30))();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Base:\t\t\t",8);
  pwVar4 = (wchar16 *)(**(code **)(*plVar3 + 0x10))(plVar3);
  pcVar5 = (char *)xercesc_4_0::XMLString::transcode
                             (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_40.fLocalForm = pcVar5;
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10d0c0);
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar6);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  StrX::~StrX(&local_40);
  uVar1 = *(uint *)(xsSimpleTypeDef + 0x38);
  if (uVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Facets:\n",8);
    FVar11 = (FACET)xsSimpleTypeDef;
    if ((uVar1 & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tLength:\t\t",10);
      pwVar4 = (wchar16 *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue(FVar11);
      pcVar5 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      local_40.fLocalForm = pcVar5;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10d0c0);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
      std::ostream::put(-0x40);
      std::ostream::flush();
      StrX::~StrX(&local_40);
    }
    if ((uVar1 & 2) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tMinLength:\t",0xc)
      ;
      pwVar4 = (wchar16 *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue(FVar11);
      pcVar5 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      local_40.fLocalForm = pcVar5;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10d0c0);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
      std::ostream::put(-0x40);
      std::ostream::flush();
      StrX::~StrX(&local_40);
    }
    if ((uVar1 & 4) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tMaxLength:\t",0xc)
      ;
      pwVar4 = (wchar16 *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue(FVar11);
      pcVar5 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      local_40.fLocalForm = pcVar5;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10d0c0);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
      std::ostream::put(-0x40);
      std::ostream::flush();
      StrX::~StrX(&local_40);
    }
    if ((((uVar1 & 8) != 0) &&
        (pBVar8 = *(BaseRefVectorOf<char16_t> **)(xsSimpleTypeDef + 0x60),
        pBVar8 != (BaseRefVectorOf<char16_t> *)0x0)) && (*(long *)(pBVar8 + 0x10) != 0)) {
      local_38 = xsSimpleTypeDef;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tPattern:\t\t",0xb)
      ;
      if (*(long *)(pBVar8 + 0x10) != 0) {
        uVar9 = 1;
        XVar10 = 0;
        do {
          pcVar7 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt(pBVar8,XVar10);
          pcVar5 = (char *)xercesc_4_0::XMLString::transcode
                                     (pcVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          local_40.fLocalForm = pcVar5;
          if (pcVar5 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10d0c0);
          }
          else {
            sVar6 = strlen(pcVar5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar6);
          }
          StrX::~StrX(&local_40);
          XVar10 = (XMLSize_t)uVar9;
          uVar9 = uVar9 + 1;
        } while (XVar10 < *(ulong *)(pBVar8 + 0x10));
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
      std::ostream::put(-0x40);
      std::ostream::flush();
      xsSimpleTypeDef = local_38;
    }
    FVar11 = (FACET)xsSimpleTypeDef;
    if ((uVar1 & 0x10) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\tWhitespace:\t\t",0xe);
      pwVar4 = (wchar16 *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue(FVar11);
      pcVar5 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      local_40.fLocalForm = pcVar5;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10d0c0);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
      std::ostream::put(-0x40);
      std::ostream::flush();
      StrX::~StrX(&local_40);
    }
    if ((uVar1 & 0x20) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\tMaxInclusive:\t",0xf);
      pwVar4 = (wchar16 *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue(FVar11);
      pcVar5 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      local_40.fLocalForm = pcVar5;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10d0c0);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
      std::ostream::put(-0x40);
      std::ostream::flush();
      StrX::~StrX(&local_40);
    }
    if ((uVar1 & 0x40) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\tMaxExclusive:\t",0xf);
      pwVar4 = (wchar16 *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue(FVar11);
      pcVar5 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      local_40.fLocalForm = pcVar5;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10d0c0);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
      std::ostream::put(-0x40);
      std::ostream::flush();
      StrX::~StrX(&local_40);
    }
    if ((char)uVar1 < '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\tMinExclusive:\t",0xf);
      pwVar4 = (wchar16 *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue(FVar11);
      pcVar5 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      local_40.fLocalForm = pcVar5;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10d0c0);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
      std::ostream::put(-0x40);
      std::ostream::flush();
      StrX::~StrX(&local_40);
    }
    if ((uVar1 >> 8 & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\tMinInclusive:\t",0xf);
      pwVar4 = (wchar16 *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue(FVar11);
      pcVar5 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      local_40.fLocalForm = pcVar5;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10d0c0);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
      std::ostream::put(-0x40);
      std::ostream::flush();
      StrX::~StrX(&local_40);
    }
    if ((uVar1 >> 9 & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\tTotalDigits:\t",0xe);
      pwVar4 = (wchar16 *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue(FVar11);
      pcVar5 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      local_40.fLocalForm = pcVar5;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10d0c0);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
      std::ostream::put(-0x40);
      std::ostream::flush();
      StrX::~StrX(&local_40);
    }
    if ((uVar1 >> 10 & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\tFractionDigits:\t",0x11);
      pwVar4 = (wchar16 *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue(FVar11);
      pcVar5 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar4,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      local_40.fLocalForm = pcVar5;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10d0c0);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
      std::ostream::put(-0x40);
      std::ostream::flush();
      StrX::~StrX(&local_40);
    }
    if ((uVar1 >> 0xb & 1) != 0) {
      pBVar8 = (BaseRefVectorOf<char16_t> *)
               xercesc_4_0::XSSimpleTypeDefinition::getLexicalEnumeration();
      if ((pBVar8 != (BaseRefVectorOf<char16_t> *)0x0) && (*(long *)(pBVar8 + 0x10) != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"\tEnumeration:\n",0xe);
        if (*(long *)(pBVar8 + 0x10) != 0) {
          XVar10 = 0;
          uVar12 = 1;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t\t",3);
            pcVar7 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt(pBVar8,XVar10);
            pcVar5 = (char *)xercesc_4_0::XMLString::transcode
                                       (pcVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
            local_40.fLocalForm = pcVar5;
            if (pcVar5 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10d0c0);
            }
            else {
              sVar6 = strlen(pcVar5);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar6)
              ;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
            StrX::~StrX(&local_40);
            bVar2 = uVar12 < *(ulong *)(pBVar8 + 0x10);
            XVar10 = uVar12;
            uVar12 = (ulong)((int)uVar12 + 1);
          } while (bVar2);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
        std::ostream::put(-0x40);
        std::ostream::flush();
      }
    }
  }
  return;
}

Assistant:

void processSimpleTypeDefinition(XSSimpleTypeDefinition * xsSimpleTypeDef)
{
    XSTypeDefinition *xsBaseTypeDef = xsSimpleTypeDef->getBaseType();
    std::cout << "Base:\t\t\t";
    std::cout << StrX(xsBaseTypeDef->getName()) << std::endl;

    int facets = xsSimpleTypeDef->getDefinedFacets();
    if (facets) {
        std::cout << "Facets:\n";

        if (facets & XSSimpleTypeDefinition::FACET_LENGTH)
                std::cout << "\tLength:\t\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_LENGTH)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_MINLENGTH)
                std::cout << "\tMinLength:\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_MINLENGTH)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_MAXLENGTH)
                std::cout << "\tMaxLength:\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_MAXLENGTH)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_PATTERN) {
            StringList *lexicalPatterns = xsSimpleTypeDef->getLexicalPattern();
            if (lexicalPatterns && lexicalPatterns->size()) {
                std::cout << "\tPattern:\t\t";
                for (unsigned i = 0; i < lexicalPatterns->size(); i++) {
                    std::cout << StrX(lexicalPatterns->elementAt(i));
                }
                std::cout << std::endl;
            }
        }
        if (facets & XSSimpleTypeDefinition::FACET_WHITESPACE)
                std::cout << "\tWhitespace:\t\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_WHITESPACE)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_MAXINCLUSIVE)
                std::cout << "\tMaxInclusive:\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_MAXINCLUSIVE)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_MAXEXCLUSIVE)
                std::cout << "\tMaxExclusive:\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_MAXEXCLUSIVE)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_MINEXCLUSIVE)
                std::cout << "\tMinExclusive:\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_MINEXCLUSIVE)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_MININCLUSIVE)
                std::cout << "\tMinInclusive:\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_MININCLUSIVE)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_TOTALDIGITS)
                std::cout << "\tTotalDigits:\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_TOTALDIGITS)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_FRACTIONDIGITS)
                std::cout << "\tFractionDigits:\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_FRACTIONDIGITS)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_ENUMERATION) {
            StringList *lexicalEnums = xsSimpleTypeDef->getLexicalEnumeration();
            if (lexicalEnums && lexicalEnums->size()) {
                std::cout << "\tEnumeration:\n";
                for (unsigned i = 0; i < lexicalEnums->size(); i++) {
                    std::cout << "\t\t\t" << StrX(lexicalEnums->elementAt(i)) << "\n";
                }
                std::cout << std::endl;
            }
        }
    }
}